

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_container_unit.c
# Opt level: O0

void run_negation_range_inplace_test2(void)

{
  _Bool in_stack_0001003e;
  _Bool in_stack_0001003f;
  int in_stack_00010040;
  int in_stack_00010044;
  int in_stack_00010048;
  int in_stack_0001004c;
  int in_stack_00010050;
  int in_stack_00010054;
  
  run_negation_range_tests
            (in_stack_00010054,in_stack_00010050,in_stack_0001004c,in_stack_00010048,
             in_stack_00010044,in_stack_00010040,in_stack_0001003f,in_stack_0001003e);
  return;
}

Assistant:

DEFINE_TEST(run_negation_range_inplace_test2) {
    // runs of length 7, 8, 9 begin every 10
    // starting at 1.
    // last run starts at 65531 hence we end in a
    // run
    // negation over whole range.  Result should be
    // bitset

    run_negation_range_tests(10, 7, 1, 0x0000, 0x10000, BITSET_CONTAINER_TYPE,
                             true,
                             false);  // request but don't get inplace
}